

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O1

bool __thiscall ON_MeshNGonEdge::SetEdgePtr(ON_MeshNGonEdge *this,ON_SubDEdgePtr eptr)

{
  uchar uVar1;
  bool bVar2;
  ON_SubDEdgePtr local_20;
  
  uVar1 = this->m_u_status;
  local_20.m_ptr = eptr.m_ptr;
  if (uVar1 == '\x01') {
    bVar2 = ON_SubDEdgePtr::IsNull(&local_20);
    this->m_u_status = !bVar2 * '\x02';
    (this->m_u).subd_edgeptr.m_ptr = local_20.m_ptr;
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  return uVar1 == '\x01';
}

Assistant:

bool SetEdgePtr(ON_SubDEdgePtr eptr)
  {
    if (1 == m_u_status)
    {
      m_u_status = eptr.IsNull() ? 0 : 2;
      m_u.subd_edgeptr = eptr;
      return true;
    }
    return ON_SUBD_RETURN_ERROR(false);
  }